

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BottomLevelASVkImpl.cpp
# Opt level: O3

void __thiscall
Diligent::BottomLevelASVkImpl::BottomLevelASVkImpl
          (BottomLevelASVkImpl *this,IReferenceCounters *pRefCounters,
          RenderDeviceVkImpl *pRenderDeviceVk,BottomLevelASDesc *Desc,RESOURCE_STATE InitialState,
          VkAccelerationStructureKHR vkBLAS)

{
  VkDeviceAddress VVar1;
  
  BottomLevelASBase<Diligent::EngineVkImplTraits>::BottomLevelASBase
            (&this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>,pRefCounters,
             pRenderDeviceVk,Desc,false);
  (this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
  super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
  .super_ObjectBase<Diligent::IBottomLevelASVk>.super_RefCountedObject<Diligent::IBottomLevelASVk>.
  super_IBottomLevelASVk.super_IBottomLevelAS.super_IDeviceObject =
       (IDeviceObject)&PTR_QueryInterface_0091bc60;
  this->m_DeviceAddress = 0;
  (this->m_VulkanBLAS).m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->m_VulkanBLAS).m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_VulkanBLAS).m_VkObject = vkBLAS;
  (this->m_VulkanBuffer).m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->m_VulkanBuffer).m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_VulkanBuffer).m_VkObject = (VkBuffer_T *)0x0;
  (this->m_MemoryAllocation).Page = (VulkanMemoryPage *)0x0;
  (this->m_MemoryAllocation).UnalignedOffset = 0;
  (this->m_MemoryAllocation).Size = 0;
  this->m_MemoryAlignedOffset = 0;
  BottomLevelASBase<Diligent::EngineVkImplTraits>::SetState
            (&this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>,InitialState);
  VVar1 = VulkanUtilities::VulkanLogicalDevice::GetAccelerationStructureDeviceAddress
                    ((pRenderDeviceVk->m_LogicalVkDevice).
                     super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,(this->m_VulkanBLAS).m_VkObject);
  this->m_DeviceAddress = VVar1;
  return;
}

Assistant:

BottomLevelASVkImpl::BottomLevelASVkImpl(IReferenceCounters*        pRefCounters,
                                         RenderDeviceVkImpl*        pRenderDeviceVk,
                                         const BottomLevelASDesc&   Desc,
                                         RESOURCE_STATE             InitialState,
                                         VkAccelerationStructureKHR vkBLAS) :
    TBottomLevelASBase{pRefCounters, pRenderDeviceVk, Desc},
    m_VulkanBLAS{vkBLAS}
{
    SetState(InitialState);
    m_DeviceAddress = pRenderDeviceVk->GetLogicalDevice().GetAccelerationStructureDeviceAddress(m_VulkanBLAS);
}